

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void smooth_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int c;
  ulong uVar5;
  int iVar6;
  byte local_40 [4];
  byte local_3c;
  uint8_t local_3b;
  uint8_t local_3a;
  uint8_t local_39;
  ptrdiff_t local_38;
  uint8_t weights [4];
  uint8_t pixels [4];
  
  local_38 = stride;
  local_39 = above[(long)bw + -1];
  uVar2 = 0;
  uVar1 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar1 = uVar2;
  }
  local_3b = left[(long)bh + -1];
  uVar3 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
      local_3c = above[uVar5];
      local_3a = left[uVar2];
      local_40[0] = (&DAT_004678e4)[uVar2 + (uint)bh];
      local_40[1] = -(&DAT_004678e4)[uVar2 + (uint)bh];
      local_40[2] = (&DAT_004678e4)[uVar5 + (uint)bw];
      local_40[3] = -(&DAT_004678e4)[uVar5 + (uint)bw];
      iVar6 = 0;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        iVar6 = iVar6 + (uint)(&local_3c)[lVar4] * (uint)local_40[lVar4];
      }
      dst[uVar5] = (uint8_t)(iVar6 + 0x100U >> 9);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void smooth_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                    int bh, const uint8_t *above,
                                    const uint8_t *left) {
  const uint8_t below_pred = left[bh - 1];   // estimated by bottom-left pixel
  const uint8_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights_w = smooth_weights + bw - 4;
  const uint8_t *const sm_weights_h = smooth_weights + bh - 4;
  // scale = 2 * 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = 1 + SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights_w, sm_weights_h, scale,
                           log2_scale + sizeof(*dst));
  int r;
  for (r = 0; r < bh; ++r) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { above[c], below_pred, left[r], right_pred };
      const uint8_t weights[] = { sm_weights_h[r], scale - sm_weights_h[r],
                                  sm_weights_w[c], scale - sm_weights_w[c] };
      uint32_t this_pred = 0;
      int i;
      assert(scale >= sm_weights_h[r] && scale >= sm_weights_w[c]);
      for (i = 0; i < 4; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}